

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

void t1_builder_init(T1_Builder builder,FT_Face face,FT_Size size,FT_GlyphSlot_conflict glyph,
                    FT_Bool hinting)

{
  FT_GlyphLoader loader;
  
  builder->parse_state = T1_Parse_Start;
  builder->load_points = '\x01';
  builder->face = face;
  builder->glyph = glyph;
  builder->memory = face->memory;
  if (glyph != (FT_GlyphSlot_conflict)0x0) {
    loader = glyph->internal->loader;
    builder->loader = loader;
    builder->base = &(loader->base).outline;
    builder->current = &(loader->current).outline;
    FT_GlyphLoader_Rewind(loader);
    builder->hints_globals = size->internal->module_data;
    builder->hints_funcs = (void *)0x0;
    if (hinting != '\0') {
      builder->hints_funcs = glyph->internal->glyph_hints;
    }
  }
  (builder->advance).x = 0;
  (builder->advance).y = 0;
  (builder->left_bearing).x = 0;
  (builder->left_bearing).y = 0;
  builder->pos_x = 0;
  builder->pos_y = 0;
  (builder->funcs).init = t1_builder_init;
  (builder->funcs).done = t1_builder_done;
  (builder->funcs).check_points = t1_builder_check_points;
  (builder->funcs).add_point = t1_builder_add_point;
  (builder->funcs).add_point1 = t1_builder_add_point1;
  (builder->funcs).add_contour = t1_builder_add_contour;
  (builder->funcs).start_point = t1_builder_start_point;
  (builder->funcs).close_contour = t1_builder_close_contour;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_builder_init( T1_Builder    builder,
                   FT_Face       face,
                   FT_Size       size,
                   FT_GlyphSlot  glyph,
                   FT_Bool       hinting )
  {
    builder->parse_state = T1_Parse_Start;
    builder->load_points = 1;

    builder->face   = face;
    builder->glyph  = glyph;
    builder->memory = face->memory;

    if ( glyph )
    {
      FT_GlyphLoader  loader = glyph->internal->loader;


      builder->loader  = loader;
      builder->base    = &loader->base.outline;
      builder->current = &loader->current.outline;
      FT_GlyphLoader_Rewind( loader );

      builder->hints_globals = size->internal->module_data;
      builder->hints_funcs   = NULL;

      if ( hinting )
        builder->hints_funcs = glyph->internal->glyph_hints;
    }

    builder->pos_x = 0;
    builder->pos_y = 0;

    builder->left_bearing.x = 0;
    builder->left_bearing.y = 0;
    builder->advance.x      = 0;
    builder->advance.y      = 0;

    builder->funcs = t1_builder_funcs;
  }